

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Expression(DataParser *parser)

{
  char cVar1;
  ulong uVar2;
  bool *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_70;
  allocator<char> local_59;
  String local_58;
  undefined1 local_38 [8];
  String name;
  bool valid_function_name;
  bool looping;
  DataParser *parser_local;
  
  Relational(parser);
  name.field_2._M_local_buf[0xf] = '\x01';
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
              return;
            }
            cVar1 = DataParser::Look(parser);
            if (cVar1 != '&') break;
            And(parser);
          }
          if (cVar1 != '?') break;
          Ternary(parser);
        }
        if (cVar1 == '|') break;
        name.field_2._M_local_buf[0xf] = '\0';
      }
      DataParser::Match(parser,'|',false);
      cVar1 = DataParser::Look(parser);
      if (cVar1 != '|') break;
      Or(parser);
    }
    DataParser::Push(parser);
    DataParser::SkipWhitespace(parser);
    name.field_2._M_local_buf[0xe] = '\x01';
    VariableOrFunctionName_abi_cxx11_
              ((String *)local_38,(Parse *)parser,(DataParser *)((long)&name.field_2 + 0xe),in_RCX);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      if ((name.field_2._M_local_buf[0xe] & 1U) == 0) {
        ::std::operator+(&local_b0,"Expected a transform function name but got an invalid name \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38);
        ::std::operator+(&local_90,&local_b0,"\'.");
        DataParser::Error(parser,&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_b0);
        local_70 = 1;
      }
      else {
        in_RCX = (bool *)0x1;
        Function(parser,TransformFnc,(String *)local_38,true);
        local_70 = 0;
      }
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Expected a transform function name but got an empty name.",
                 &local_59);
      DataParser::Error(parser,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator(&local_59);
      local_70 = 1;
    }
    ::std::__cxx11::string::~string((string *)local_38);
  } while (local_70 == 0);
  return;
}

Assistant:

static void Expression(DataParser& parser)
	{
		Relational(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '&': And(parser); break;
			case '|':
			{
				parser.Match('|', false);
				if (parser.Look() == '|')
					Or(parser);
				else
				{
					parser.Push();
					parser.SkipWhitespace();
					bool valid_function_name = true;
					String name = VariableOrFunctionName(parser, &valid_function_name);
					if (name.empty())
					{
						parser.Error("Expected a transform function name but got an empty name.");
						return;
					}
					if (!valid_function_name)
					{
						parser.Error("Expected a transform function name but got an invalid name '" + name + "'.");
						return;
					}

					Function(parser, Instruction::TransformFnc, std::move(name), true);
				}
			}
			break;
			case '?': Ternary(parser); break;
			default: looping = false;
			}
		}
	}